

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  JsonNode *pJVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  JsonNode *pJVar10;
  uint uVar11;
  uint uVar12;
  u32 n;
  u8 *puVar13;
  int iVar14;
  char *zContent;
  ulong uVar15;
  JsonNode *pJVar16;
  bool bVar17;
  ulong local_78;
  
  local_78 = (ulong)iRoot;
  pJVar6 = pParse->aNode;
LAB_001bf581:
  pJVar16 = pJVar6 + local_78;
  cVar2 = *zPath;
  if (cVar2 != '\0') {
    if ((pJVar16->jnFlags & 8) == 0) {
      iVar5 = 1;
      if (cVar2 == '.') {
        if (pJVar16->eType == '\a') {
          pcVar1 = zPath + 1;
          cVar2 = zPath[1];
          if (cVar2 == '\"') {
            uVar7 = 0;
            while( true ) {
              uVar3 = (int)uVar7 + 1;
              if (pcVar1[uVar3] == '\0') goto LAB_001bf90e;
              if (pcVar1[uVar3] == '\"') break;
              uVar7 = (ulong)uVar3;
            }
            uVar8 = (ulong)((int)uVar7 + 2);
            zContent = zPath + 2;
LAB_001bf71d:
            n = (u32)uVar7;
            do {
              uVar3 = pJVar16->n;
              uVar15 = 1;
              while( true ) {
                uVar11 = (uint)uVar15;
                iVar14 = (int)local_78;
                if (uVar3 < uVar11) break;
                if ((pJVar16[uVar15].jnFlags & 1) == 0) {
                  if (pJVar16[uVar15].n == n + 2) {
                    puVar13 = &(pJVar16[uVar15].u.pPatch)->jnFlags;
LAB_001bf784:
                    iVar4 = strncmp((char *)puVar13,zContent,uVar7);
                    if (iVar4 == 0) {
                      local_78 = (ulong)(iVar14 + uVar11 + 1);
                      zPath = pcVar1 + uVar8;
                      goto LAB_001bf581;
                    }
                  }
                }
                else if (pJVar16[uVar15].n == n) {
                  puVar13 = (u8 *)pJVar16[uVar15].u.zJContent;
                  goto LAB_001bf784;
                }
                uVar11 = uVar11 + 1;
                iVar14 = iVar5;
                if (5 < pJVar16[uVar11].eType) {
                  iVar14 = pJVar16[uVar11].n + 1;
                }
                uVar15 = (ulong)(iVar14 + uVar11);
              }
              if ((pJVar16->jnFlags & 0x20) == 0) {
                if (pApnd != (int *)0x0) {
                  iVar5 = jsonParseAddNode(pParse,7,2,(char *)0x0);
                  uVar3 = jsonParseAddNode(pParse,5,n,zContent);
                  pJVar6 = jsonLookupAppend(pParse,pcVar1 + uVar8,pApnd,pzErr);
                  if (pParse->oom != '\0') {
                    return (JsonNode *)0x0;
                  }
                  if (pJVar6 == (JsonNode *)0x0) {
                    return (JsonNode *)0x0;
                  }
                  pJVar16 = pParse->aNode;
                  pJVar16[local_78].u.iAppend = iVar5 - iVar14;
                  puVar13 = &pJVar16[local_78].jnFlags;
                  *puVar13 = *puVar13 | 0x20;
                  puVar13 = &pParse->aNode[uVar3].jnFlags;
                  *puVar13 = *puVar13 | 1;
                  return pJVar6;
                }
                goto LAB_001bf916;
              }
              local_78 = (ulong)(iVar14 + (pJVar16->u).iAppend);
              pJVar16 = pJVar6 + local_78;
            } while( true );
          }
          uVar8 = 0;
          while (((cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '['))) {
            uVar8 = (ulong)((int)uVar8 + 1);
            cVar2 = pcVar1[uVar8];
          }
          uVar7 = uVar8;
          zContent = pcVar1;
          if ((int)uVar8 != 0) goto LAB_001bf71d;
LAB_001bf90e:
          *pzErr = pcVar1;
        }
      }
      else {
        if (cVar2 == '[') {
          uVar3 = 0;
          uVar7 = 1;
          while( true ) {
            uVar11 = (uint)uVar7;
            bVar9 = zPath[uVar7];
            if ((ulong)bVar9 - 0x3a < 0xfffffffffffffff6) break;
            uVar3 = (uVar3 * 10 + (int)(char)bVar9) - 0x30;
            uVar7 = (ulong)(uVar11 + 1);
          }
          if ((1 < uVar11) && (bVar9 == 0x5d)) {
            if (pJVar16->eType == '\x06') goto LAB_001bf822;
            goto LAB_001bf916;
          }
          if (zPath[1] == '#') {
            pJVar10 = pJVar16;
            uVar8 = local_78;
            if (pJVar16->eType != '\x06') goto LAB_001bf916;
            while( true ) {
              for (; (uint)uVar7 <= pJVar10->n; uVar7 = (ulong)((uint)uVar7 + iVar14)) {
                uVar3 = uVar3 + ((pJVar10[uVar7].jnFlags & 4) == 0);
                iVar14 = iVar5;
                if (5 < pJVar10[uVar7].eType) {
                  iVar14 = pJVar10[uVar7].n + 1;
                }
              }
              if ((pJVar10->jnFlags & 0x20) == 0) break;
              uVar11 = (int)uVar8 + (pJVar10->u).iAppend;
              uVar7 = 1;
              pJVar10 = pJVar6 + (int)uVar11;
              uVar8 = (ulong)uVar11;
            }
            bVar9 = zPath[2];
            if (bVar9 == 0x2d) {
              uVar7 = (ulong)(byte)zPath[3];
              if (uVar7 - 0x3a < 0xfffffffffffffff6) goto LAB_001bf913;
              uVar12 = 0;
              uVar8 = 3;
              do {
                uVar12 = (uVar12 * 10 + (int)(char)uVar7) - 0x30;
                uVar11 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar11;
                bVar9 = zPath[uVar8];
                uVar7 = (ulong)bVar9;
              } while (0xfffffffffffffff5 < uVar7 - 0x3a);
              bVar17 = uVar3 < uVar12;
              uVar3 = uVar3 - uVar12;
              if (bVar17) goto LAB_001bf916;
            }
            else {
              uVar11 = 2;
            }
            if (bVar9 == 0x5d) {
LAB_001bf822:
              zPath = zPath + (uVar11 + 1);
              do {
                uVar7 = 1;
                while( true ) {
                  uVar11 = (uint)uVar7;
                  iVar14 = (int)local_78;
                  if (pJVar16->n < uVar11) break;
                  if ((uVar3 == 0) && ((pJVar16[uVar7].jnFlags & 4) == 0)) {
                    uVar3 = 0;
                    if ((pJVar16->jnFlags & 0x20) != 0) goto LAB_001bf88b;
                    local_78 = (ulong)(uVar11 + iVar14);
                    goto LAB_001bf581;
                  }
                  iVar14 = iVar5;
                  if (5 < pJVar16[uVar7].eType) {
                    iVar14 = pJVar16[uVar7].n + 1;
                  }
                  uVar3 = uVar3 + (int)(char)(((pJVar16[uVar7].jnFlags >> 2 & 1) != 0) + -1);
                  uVar7 = (ulong)(uVar11 + iVar14);
                }
                if ((pJVar16->jnFlags & 0x20) == 0) {
                  if (pApnd == (int *)0x0) {
                    return (JsonNode *)0x0;
                  }
                  if (uVar3 != 0) {
                    return (JsonNode *)0x0;
                  }
                  iVar5 = jsonParseAddNode(pParse,6,1,(char *)0x0);
                  pJVar6 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
                  if (pParse->oom != '\0') {
                    return (JsonNode *)0x0;
                  }
                  if (pJVar6 == (JsonNode *)0x0) {
                    return (JsonNode *)0x0;
                  }
                  pJVar16 = pParse->aNode;
                  pJVar16[local_78].u.iAppend = iVar5 - iVar14;
                  puVar13 = &pJVar16[local_78].jnFlags;
                  *puVar13 = *puVar13 | 0x20;
                  return pJVar6;
                }
LAB_001bf88b:
                local_78 = (ulong)(iVar14 + (pJVar16->u).iAppend);
                pJVar16 = pJVar6 + local_78;
              } while( true );
            }
          }
        }
LAB_001bf913:
        *pzErr = zPath;
      }
    }
LAB_001bf916:
    pJVar16 = (JsonNode *)0x0;
  }
  return pJVar16;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( pRoot->jnFlags & JNODE_REPLACE ) return 0;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
      testcase( nKey==0 );
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        *pzErr = zPath;
        return 0;
      }
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' ){
    i = 0;
    j = 1;
    while( sqlite3Isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( j<2 || zPath[j]!=']' ){
      if( zPath[1]=='#' ){
        JsonNode *pBase = pRoot;
        int iBase = iRoot;
        if( pRoot->eType!=JSON_ARRAY ) return 0;
        for(;;){
          while( j<=pBase->n ){
            if( (pBase[j].jnFlags & JNODE_REMOVE)==0 ) i++;
            j += jsonNodeSize(&pBase[j]);
          }
          if( (pBase->jnFlags & JNODE_APPEND)==0 ) break;
          assert( pBase->eU==2 );
          iBase += pBase->u.iAppend;
          pBase = &pParse->aNode[iBase];
          j = 1;
        }
        j = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int x = 0;
          j = 3;
          do{
            x = x*10 + zPath[j] - '0';
            j++;
          }while( sqlite3Isdigit(zPath[j]) );
          if( x>i ) return 0;
          i -= x;
        }
        if( zPath[j]!=']' ){
          *pzErr = zPath;
          return 0;
        }
      }else{
        *pzErr = zPath;
        return 0;
      }
    }
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}